

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O0

void __thiscall
agge::tests::mocks::blender<int,_short>::operator()
          (blender<int,_short> *this,int *pixels,int x,int y,uint length,cover_type_conflict *covers
          )

{
  int mask_y;
  int mask_x;
  int offset;
  allocator local_81;
  string local_80 [32];
  LocationInfo local_60;
  uint local_34;
  short *local_30;
  cover_type_conflict *covers_local;
  int local_20;
  uint length_local;
  int y_local;
  int x_local;
  int *pixels_local;
  blender<int,_short> *this_local;
  
  local_34 = 0;
  local_30 = covers;
  covers_local._4_4_ = length;
  local_20 = y;
  length_local = x;
  _y_local = pixels;
  pixels_local = (int *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/mocks.h",
             &local_81);
  ut::LocationInfo::LocationInfo(&local_60,(string *)local_80,0x101);
  ut::are_not_equal<unsigned_int,unsigned_int>
            (&local_34,(uint *)((long)&covers_local + 4),&local_60);
  ut::LocationInfo::~LocationInfo(&local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  for (; covers_local._4_4_ != 0; covers_local._4_4_ = covers_local._4_4_ - 1) {
    *_y_local = (int)*local_30 + (length_local & 0xff) * 0x10000 + local_20 * 0x1000000;
    _y_local = _y_local + 1;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void operator ()(PixelT *pixels, int x, int y, unsigned int length, const cover_type *covers) const
				{
					assert_not_equal(0u, length);

					int offset = sizeof(cover_type) * 8;
					int mask_x = 0x000000FF << offset;
					int mask_y = 0x0000FF00 << offset;

					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ ((x << offset) & mask_x)
							+ ((y << (offset + 8)) & mask_y));
				}